

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void __thiscall
Lib::
Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>
::expand(Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>
         *this)

{
  FoundVarInLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pFVar1;
  ulong *in_RDI;
  size_t i;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_> *newStack;
  void *mem;
  size_t newCapacity;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_> *local_38;
  ulong local_28;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pFVar2;
  
  if (*in_RDI == 0) {
    local_38 = (FoundVarInLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x8;
  }
  else {
    local_38 = (FoundVarInLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)(*in_RDI << 1);
  }
  pFVar1 = (FoundVarInLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
           Lib::alloc((size_t)in_RDI);
  if (*in_RDI != 0) {
    pFVar2 = pFVar1;
    for (local_28 = 0; local_28 < *in_RDI; local_28 = local_28 + 1) {
      Inferences::ALASCA::VariableElimination::
      FoundVarInLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>::FoundVarInLiteral
                (local_38,pFVar2);
      Inferences::ALASCA::VariableElimination::
      FoundVarInLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>::~FoundVarInLiteral
                ((FoundVarInLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x713e7a);
    }
    Lib::free((void *)in_RDI[1]);
  }
  in_RDI[1] = (ulong)pFVar1;
  in_RDI[2] = in_RDI[1] + *in_RDI * 0x30;
  in_RDI[3] = in_RDI[1] + (long)local_38 * 0x30;
  *in_RDI = (ulong)local_38;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }